

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O0

void __thiscall libchars::token::token(token *this,type_t ttype_,id_t ID_,id_t vtype_,char *name_)

{
  char *name__local;
  id_t vtype__local;
  id_t ID__local;
  type_t ttype__local;
  token *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->name);
  this->ttype = ttype_;
  std::__cxx11::string::string((string *)&this->help);
  this->ID = ID_;
  this->status = 0;
  this->vtype = vtype_;
  this->offset = 0;
  this->length = 0;
  this->next = (token *)0x0;
  if (name_ != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->name);
  }
  return;
}

Assistant:

token::token(type_t ttype_, id_t ID_, id_t vtype_, const char *name_) :
          ttype(ttype_),ID(ID_),
          status(0),vtype(vtype_),
          offset(0),length(0),
          next(NULL)
    {
        if (name_ != NULL)
            name.assign(name_);
    }